

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::
string_maker<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          string_maker<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
          *this,value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>
                *value)

{
  uint *puVar1;
  ostringstream os;
  size_type *local_1b0;
  size_type local_1a8;
  size_type local_1a0;
  undefined8 uStack_198;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[value_ptr: ",0xc);
  if (*(int **)this == (int *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[empty]",7);
  }
  else {
    std::ostream::operator<<((ostream *)local_190,**(int **)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"]",1);
  std::__cxx11::stringbuf::str();
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }